

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::InspectInstrForMemCopyCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemCopyEmitData *emitData,bool *errorInInstr)

{
  code *pcVar1;
  bool bVar2;
  SymID SVar3;
  BailOutKind BVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  IndirOpnd *pIVar9;
  RegOpnd *pRVar10;
  StackSym *pSVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  Instr *__instr___2;
  char16 debugStringBuffer_2 [42];
  Instr *__instr___1;
  char16 debugStringBuffer_1 [42];
  wchar local_4a8 [4];
  char16 ldValueTypeStr [256];
  char16 stValueTypeStr [256];
  ValueType ldValueType;
  ValueType stValueType;
  Instr *__instr__;
  char16 debugStringBuffer [42];
  MemCopyCandidate *candidate;
  bool *errorInInstr_local;
  MemCopyEmitData *emitData_local;
  Instr *instr_local;
  Loop *loop_local;
  GlobOpt *this_local;
  
  if (((emitData == (MemCopyEmitData *)0x0) ||
      ((emitData->super_MemOpEmitData).candidate == (MemOpCandidate *)0x0)) ||
     (bVar2 = Loop::MemOpCandidate::IsMemCopy((emitData->super_MemOpEmitData).candidate), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4472,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemCopy())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemCopy()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  unique0x00012000 = (emitData->super_MemOpEmitData).candidate;
  if ((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) {
    if (instr->m_opcode != LdElemI_A) {
      return false;
    }
    if ((emitData->super_MemOpEmitData).stElemInstr != (Instr *)0x0) {
      pOVar8 = IR::Instr::GetSrc1(instr);
      bVar2 = IR::Opnd::IsIndirOpnd(pOVar8);
      if (bVar2) {
        pOVar8 = IR::Instr::GetSrc1(instr);
        pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
        pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
        pSVar11 = IR::Opnd::GetStackSym(&pRVar10->super_Opnd);
        SVar3 = GetVarSymID(this,pSVar11);
        if (SVar3 == stack0xffffffffffffffc0[1].base) {
          pOVar8 = IR::Instr::GetSrc1(instr);
          pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
          pRVar10 = IR::IndirOpnd::GetIndexOpnd(pIVar9);
          pSVar11 = IR::Opnd::GetStackSym(&pRVar10->super_Opnd);
          SVar3 = GetVarSymID(this,pSVar11);
          if (SVar3 == stack0xffffffffffffffc0->index) {
            bVar2 = IR::Instr::IsProfiledInstr(instr);
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x448e,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            emitData->ldElemInstr = instr;
            pOVar8 = IR::Instr::GetDst((emitData->super_MemOpEmitData).stElemInstr);
            pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
            pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
            stValueTypeStr[0xff] = (char16)IR::Opnd::GetValueType(&pRVar10->super_Opnd);
            pOVar8 = IR::Instr::GetSrc1(emitData->ldElemInstr);
            pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
            pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
            stValueTypeStr[0xfd] = (char16)IR::Opnd::GetValueType(&pRVar10->super_Opnd);
            stValueTypeStr[0xfe] = stValueTypeStr[0xfd];
            bVar2 = ValueType::operator!=
                              ((ValueType *)(stValueTypeStr + 0xff),(ValueType)stValueTypeStr[0xfd])
            ;
            if (!bVar2) {
              return true;
            }
            ValueType::ToString((ValueType *)(stValueTypeStr + 0xff),
                                (wchar (*) [256])(ldValueTypeStr + 0xfc));
            ValueType::ToString((ValueType *)(stValueTypeStr + 0xfe),(wchar (*) [256])local_4a8);
            if ((DAT_01ec73ca & 1) != 0) {
              uVar5 = Func::GetSourceContextId(this->func);
              uVar6 = Func::GetLocalFunctionId(this->func);
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar5,uVar6);
              if (!bVar2) {
                uVar5 = Func::GetSourceContextId(this->func);
                uVar6 = Func::GetLocalFunctionId(this->func);
                bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar5,uVar6);
                if (!bVar2) goto LAB_005b63dc;
              }
              Output::Print(L"TRACE MemCopy:");
              pJVar12 = Func::GetJITFunctionBody(this->func);
              pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___1);
              uVar5 = Loop::GetLoopNumber(loop);
              Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar5);
              Output::Print(L"for mismatch in Load(%s) and Store(%s) value type",local_4a8,
                            ldValueTypeStr + 0xfc);
              unique0x10000b7a = instr;
              if (instr != (Instr *)0x0) {
                IR::Instr::DumpByteCodeOffset(instr);
              }
              if (stack0xfffffffffffffaf0 != (Instr *)0x0) {
                pcVar13 = Js::OpCodeUtil::GetOpCodeName(stack0xfffffffffffffaf0->m_opcode);
                Output::Print(L" (%s)",pcVar13);
              }
              Output::Print(L"\n");
              Output::Flush();
            }
LAB_005b63dc:
            *errorInInstr = true;
            return false;
          }
        }
      }
    }
    if ((DAT_01ec73ca & 1) != 0) {
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar5,uVar6);
      if (!bVar2) {
        uVar5 = Func::GetSourceContextId(this->func);
        uVar6 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar5,uVar6);
        if (!bVar2) goto LAB_005b65a2;
      }
      Output::Print(L"TRACE MemCopy:");
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___2);
      uVar5 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar5);
      Output::Print(L"Orphan LdElemI_A detected");
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar13);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
LAB_005b65a2:
    *errorInInstr = true;
    return false;
  }
  pOVar8 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar8);
  if (bVar2) {
    pOVar8 = IR::Instr::GetDst(instr);
    pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
    pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
    pSVar11 = IR::Opnd::GetStackSym(&pRVar10->super_Opnd);
    SVar3 = GetVarSymID(this,pSVar11);
    if (SVar3 == stack0xffffffffffffffc0->base) {
      pOVar8 = IR::Instr::GetDst(instr);
      pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
      pRVar10 = IR::IndirOpnd::GetIndexOpnd(pIVar9);
      pSVar11 = IR::Opnd::GetStackSym(&pRVar10->super_Opnd);
      SVar3 = GetVarSymID(this,pSVar11);
      if (SVar3 == stack0xffffffffffffffc0->index) {
        bVar2 = IR::Instr::IsProfiledInstr(instr);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x447c,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        (emitData->super_MemOpEmitData).stElemInstr = instr;
        BVar4 = IR::Instr::GetBailOutKind(instr);
        (emitData->super_MemOpEmitData).bailOutKind = BVar4;
        return false;
      }
    }
  }
  if ((DAT_01ec73ca & 1) != 0) {
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar5,uVar6);
    if (!bVar2) {
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar5,uVar6);
      if (!bVar2) goto LAB_005b6032;
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar12 = Func::GetJITFunctionBody(this->func);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr__);
    uVar5 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar5);
    Output::Print(L"Orphan StElemI_A detected");
    if (instr != (Instr *)0x0) {
      IR::Instr::DumpByteCodeOffset(instr);
      pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
      Output::Print(L" (%s)",pcVar13);
    }
    Output::Print(L"\n");
    Output::Flush();
  }
LAB_005b6032:
  *errorInInstr = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemCopyCandidate(Loop* loop, IR::Instr* instr, MemCopyEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemCopy());
    Loop::MemCopyCandidate* candidate = (Loop::MemCopyCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (
            instr->GetDst()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base) &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            // Still need to find the LdElem
            return false;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        if (
            emitData->stElemInstr &&
            instr->GetSrc1()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->ldBase) &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->ldElemInstr = instr;
            ValueType stValueType = emitData->stElemInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            ValueType ldValueType = emitData->ldElemInstr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            if (stValueType != ldValueType)
            {
#if DBG_DUMP
                char16 stValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                stValueType.ToString(stValueTypeStr);
                char16 ldValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                ldValueType.ToString(ldValueTypeStr);
                TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("for mismatch in Load(%s) and Store(%s) value type"), ldValueTypeStr, stValueTypeStr);
#endif
                errorInInstr = true;
                return false;
            }
            // We found both instruction for this candidate
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}